

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void __thiscall
embree::TutorialBenchmark::updateCommandLine(TutorialBenchmark *this,int *argc,char **argv)

{
  bool bVar1;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  int j;
  int remove;
  int i;
  string *str;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined7 in_stack_fffffffffffffef8;
  byte in_stack_fffffffffffffeff;
  string *in_stack_ffffffffffffff00;
  string *str_00;
  undefined6 in_stack_ffffffffffffff18;
  byte in_stack_ffffffffffffff1e;
  byte in_stack_ffffffffffffff1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_c9 [38];
  byte local_a3;
  byte local_a2;
  allocator local_a1;
  string local_a0 [36];
  int local_7c;
  int local_78;
  allocator local_61;
  string local_60 [36];
  int local_3c;
  reference local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  long local_20;
  long local_18;
  int *local_10;
  
  local_20 = in_RDI + 0x78;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffff00,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8)), bVar1
        ) {
    local_38 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_28);
    for (local_3c = 0; local_3c < *local_10; local_3c = local_3c + 1) {
      __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               (local_18 + (long)local_3c * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,(char *)__lhs,&local_61);
      in_stack_ffffffffffffff1f =
           std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_ffffffffffffff1f,
                                             CONCAT16(in_stack_ffffffffffffff1e,
                                                      in_stack_ffffffffffffff18)));
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      if ((in_stack_ffffffffffffff1f & 1) != 0) {
        local_78 = 1;
        local_7c = local_3c;
        while( true ) {
          local_7c = local_7c + 1;
          local_a2 = 0;
          local_a3 = 0;
          in_stack_fffffffffffffeff = 0;
          in_stack_ffffffffffffff1e = in_stack_fffffffffffffeff;
          if (local_7c < *local_10) {
            str_00 = *(string **)(local_18 + (long)local_7c * 8);
            std::allocator<char>::allocator();
            local_a2 = 1;
            std::__cxx11::string::string(local_a0,(char *)str_00,&local_a1);
            local_a3 = 1;
            in_stack_ffffffffffffff00 = (string *)local_c9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_c9 + 1),"-",(allocator *)in_stack_ffffffffffffff00);
            bVar1 = startsWith(str_00,in_stack_ffffffffffffff00);
            in_stack_fffffffffffffeff = bVar1 ^ 0xff;
            in_stack_ffffffffffffff1e = in_stack_fffffffffffffeff;
            std::__cxx11::string::~string((string *)(local_c9 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_c9);
          }
          if ((local_a3 & 1) != 0) {
            std::__cxx11::string::~string(local_a0);
          }
          if ((local_a2 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_a1);
          }
          if ((in_stack_fffffffffffffeff & 1) == 0) break;
          local_78 = local_78 + 1;
        }
        *local_10 = *local_10 - local_78;
        for (local_7c = local_3c; local_7c < *local_10; local_7c = local_7c + 1) {
          *(undefined8 *)(local_18 + (long)local_7c * 8) =
               *(undefined8 *)(local_18 + (long)(local_7c + local_78) * 8);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void TutorialBenchmark::updateCommandLine(int& argc, char** argv)
{
  for (std::string const& str : processedCommandLineOptions)
  {
    for (int i = 0; i < argc; ++i) {
      if (std::string(argv[i]) == str) {
        int remove = 1;
        int j = i+1;
        while(j < argc && !startsWith(std::string(argv[j]), "-")) {
          remove++;
          j++;
        }
        argc -= remove;
        for (j = i; j < argc; ++j) {
          argv[j] = argv[j+remove];
        }
      }
    }
  }
}